

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::DeleteObsoleteFiles(DBImpl *this)

{
  Env *pEVar1;
  pointer pcVar2;
  pointer pbVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 uVar8;
  _Base_ptr p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  _Base_ptr p_Var13;
  pointer pbVar14;
  string *filename;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_to_delete;
  FileType type;
  uint64_t number;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> live;
  void *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  FileType local_dc;
  ulong local_d8;
  void *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bg_error_).state_ == (char *)0x0) {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_Rb_tree(&local_68,&(this->pending_outputs_)._M_t);
    VersionSet::AddLiveFiles
              (this->versions_,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &local_68);
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*this->env_->_vptr_Env[7])(&local_d0,this->env_,&this->dbname_);
    if (local_d0 != (void *)0x0) {
      operator_delete__(local_d0);
    }
    pbVar3 = local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar5 = ParseFileName(pbVar14,&local_d8,&local_dc);
        if (!bVar5) goto switchD_00cec41c_caseD_1;
        switch(local_dc) {
        case kLogFile:
          if ((local_d8 < this->versions_->log_number_) &&
             (local_d8 != this->versions_->prev_log_number_)) goto LAB_00cec4fb;
          break;
        case kTableFile:
          if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var4 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var13 = &local_68._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var9 = p_Var13;
              p_Var11 = p_Var4;
              uVar12 = *(ulong *)(p_Var11 + 1);
              p_Var13 = p_Var11;
              if (uVar12 < local_d8) {
                p_Var13 = p_Var9;
              }
              p_Var4 = (&p_Var11->_M_left)[uVar12 < local_d8];
            } while ((&p_Var11->_M_left)[uVar12 < local_d8] != (_Base_ptr)0x0);
LAB_00cec4e1:
            if ((_Rb_tree_header *)p_Var13 != &local_68._M_impl.super__Rb_tree_header) {
              if (uVar12 < local_d8) {
                p_Var11 = p_Var9;
              }
              if (*(ulong *)(p_Var11 + 1) <= local_d8) break;
            }
          }
          goto LAB_00cec4fb;
        case kDescriptorFile:
          if (local_d8 < this->versions_->manifest_file_number_) goto LAB_00cec4fb;
          break;
        case kTempFile:
          if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var4 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var13 = &local_68._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var9 = p_Var13;
              p_Var11 = p_Var4;
              uVar12 = *(ulong *)(p_Var11 + 1);
              p_Var13 = p_Var11;
              if (uVar12 < local_d8) {
                p_Var13 = p_Var9;
              }
              p_Var4 = (&p_Var11->_M_left)[uVar12 < local_d8];
            } while ((&p_Var11->_M_left)[uVar12 < local_d8] != (_Base_ptr)0x0);
            goto LAB_00cec4e1;
          }
LAB_00cec4fb:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     pbVar14);
          if (local_dc == kTableFile) {
            TableCache::Evict(this->table_cache_,local_d8);
          }
          Log((this->options_).info_log,"Delete type=%d #%lld\n",(ulong)local_dc,local_d8);
        }
switchD_00cec41c_caseD_1:
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    pbVar3 = local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pEVar1 = this->env_;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar2 = (this->dbname_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,pcVar2 + (this->dbname_)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_a8,"/");
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_a8,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
        local_88 = (size_type *)(pbVar7->_M_dataplus)._M_p;
        paVar10 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88 == paVar10) {
          local_78 = paVar10->_M_allocated_capacity;
          uStack_70 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
          uStack_6c = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
          local_88 = &local_78;
        }
        else {
          local_78 = paVar10->_M_allocated_capacity;
        }
        local_80 = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        (*pEVar1->_vptr_Env[8])(&local_100,pEVar1,&local_88);
        if (local_100 != (void *)0x0) {
          operator_delete__(local_100);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
    }
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    if (iVar6 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar8 = std::__throw_system_error(iVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_68);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar8);
        }
      }
      goto LAB_00cec7a7;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00cec7a7:
  __stack_chk_fail();
}

Assistant:

void DBImpl::DeleteObsoleteFiles() {
  mutex_.AssertHeld();

  if (!bg_error_.ok()) {
    // After a background error, we don't know whether a new version may
    // or may not have been committed, so we cannot safely garbage collect.
    return;
  }

  // Make a set of all of the live files
  std::set<uint64_t> live = pending_outputs_;
  versions_->AddLiveFiles(&live);

  std::vector<std::string> filenames;
  env_->GetChildren(dbname_, &filenames);  // Ignoring errors on purpose
  uint64_t number;
  FileType type;
  std::vector<std::string> files_to_delete;
  for (std::string& filename : filenames) {
    if (ParseFileName(filename, &number, &type)) {
      bool keep = true;
      switch (type) {
        case kLogFile:
          keep = ((number >= versions_->LogNumber()) ||
                  (number == versions_->PrevLogNumber()));
          break;
        case kDescriptorFile:
          // Keep my manifest file, and any newer incarnations'
          // (in case there is a race that allows other incarnations)
          keep = (number >= versions_->ManifestFileNumber());
          break;
        case kTableFile:
          keep = (live.find(number) != live.end());
          break;
        case kTempFile:
          // Any temp files that are currently being written to must
          // be recorded in pending_outputs_, which is inserted into "live"
          keep = (live.find(number) != live.end());
          break;
        case kCurrentFile:
        case kDBLockFile:
        case kInfoLogFile:
          keep = true;
          break;
      }

      if (!keep) {
        files_to_delete.push_back(std::move(filename));
        if (type == kTableFile) {
          table_cache_->Evict(number);
        }
        Log(options_.info_log, "Delete type=%d #%lld\n", static_cast<int>(type),
            static_cast<unsigned long long>(number));
      }
    }
  }

  // While deleting all files unblock other threads. All files being deleted
  // have unique names which will not collide with newly created files and
  // are therefore safe to delete while allowing other threads to proceed.
  mutex_.Unlock();
  for (const std::string& filename : files_to_delete) {
    env_->DeleteFile(dbname_ + "/" + filename);
  }
  mutex_.Lock();
}